

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

void Gia_IsoAssignOneClass(Gia_IsoMan_t *p,int fVerbose)

{
  uint uVar1;
  int *piVar2;
  word *pwVar3;
  long lVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar1 = p->vClasses->nSize;
  lVar4 = (long)(int)uVar1;
  if (lVar4 < 1) {
    __assert_fail("Vec_IntSize(p->vClasses) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,0x24f,"void Gia_IsoAssignOneClass(Gia_IsoMan_t *, int)");
  }
  if (uVar1 == 1) {
LAB_00747c77:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar2 = p->vClasses->pArray;
  uVar7 = uVar1 + 2;
  lVar10 = lVar4;
  do {
    uVar8 = uVar1 & 1;
    if (lVar10 < 2) break;
    if (lVar4 <= lVar4 + -2) goto LAB_00747c77;
    lVar9 = lVar10 + -2;
    uVar7 = uVar7 - 2;
    lVar10 = lVar10 + -2;
    uVar8 = uVar7;
  } while (p->pLevels[*(uint *)((long)p->pStoreW + (long)piVar2[lVar9] * 8 + 4)] ==
           p->pLevels[*(uint *)((long)p->pStoreW + (long)piVar2[lVar4 + -2] * 8 + 4)]);
  if ((int)uVar8 < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,600,"void Gia_IsoAssignOneClass(Gia_IsoMan_t *, int)");
  }
  pVVar5 = p->vClasses;
  iVar6 = pVVar5->nSize;
  if ((int)uVar8 < iVar6) {
    uVar12 = (ulong)uVar8;
    do {
      if (iVar6 <= (int)uVar12 + 1) goto LAB_00747c77;
      lVar4 = (long)pVVar5->pArray[uVar12];
      lVar10 = (long)pVVar5->pArray[uVar12 + 1];
      if (0 < lVar10) {
        piVar2 = p->pUniques;
        pwVar3 = p->pStoreW;
        lVar9 = 0;
        do {
          uVar11 = pwVar3[lVar4 + lVar9] >> 0x20;
          if (piVar2[uVar11] != 0) {
            __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin+k)] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                          ,0x260,"void Gia_IsoAssignOneClass(Gia_IsoMan_t *, int)");
          }
          iVar6 = p->nUniques;
          p->nUniques = iVar6 + 1;
          piVar2[uVar11] = iVar6;
          p->nSingles = p->nSingles + 1;
          p->nEntries = p->nEntries + -1;
          lVar9 = lVar9 + 1;
        } while (lVar10 != lVar9);
      }
      if (fVerbose != 0) {
        printf("Broke ties in class of size %d at level %d.\n",lVar10,
               (ulong)(uint)p->pLevels[*(uint *)((long)p->pStoreW + lVar4 * 8 + 4)]);
      }
      uVar12 = uVar12 + 2;
      pVVar5 = p->vClasses;
      iVar6 = pVVar5->nSize;
    } while ((int)uVar12 < iVar6);
  }
  if (iVar6 < (int)uVar8) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  pVVar5->nSize = uVar8;
  return;
}

Assistant:

void Gia_IsoAssignOneClass( Gia_IsoMan_t * p, int fVerbose )
{
    int i, k, iBegin0, iBegin, nSize, Shrink;
    // find the classes with the highest level
    assert( Vec_IntSize(p->vClasses) > 0 );
    iBegin0 = Vec_IntEntry( p->vClasses, Vec_IntSize(p->vClasses) - 2 );
    for ( i = Vec_IntSize(p->vClasses) - 2; i >= 0; i -= 2 )
    {
        iBegin = Vec_IntEntry( p->vClasses, i );
        if ( p->pLevels[Gia_IsoGetItem(p, iBegin)] != p->pLevels[Gia_IsoGetItem(p, iBegin0)] )
            break;
    }
    i += 2;
    assert( i >= 0 );
    // assign all classes starting with this one
    for ( Shrink = i; i < Vec_IntSize(p->vClasses); i += 2 )
    {
        iBegin = Vec_IntEntry( p->vClasses, i );
        nSize  = Vec_IntEntry( p->vClasses, i + 1 );
        for ( k = 0; k < nSize; k++ )
        {
            assert( p->pUniques[Gia_IsoGetItem(p, iBegin+k)] == 0 );
            p->pUniques[Gia_IsoGetItem(p, iBegin+k)] = p->nUniques++;
//            Gia_ManObj(p->pGia, Gia_IsoGetItem(p, iBegin+k))->Value += s_256Primes[0]; ///  new addition!!!
            p->nSingles++;
            p->nEntries--;
        }
        if ( fVerbose )
            printf( "Broke ties in class of size %d at level %d.\n", nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
    }
    Vec_IntShrink( p->vClasses, Shrink );
}